

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

enable_if_t<std::is_base_of<_::acto::actor,_Listener>::value,_actor_ref> __thiscall
acto::spawn<Listener>(acto *this,actor_ref *context)

{
  object_t *an_object;
  unique_ptr<Listener,_std::default_delete<Listener>_> local_30;
  unique_ptr<acto::actor,_std::default_delete<acto::actor>_> local_28;
  actor_ref local_20;
  actor_ref *local_18;
  actor_ref *context_local;
  
  local_18 = context;
  context_local = (actor_ref *)this;
  actor_ref::actor_ref(&local_20,context);
  std::make_unique<Listener>();
  std::unique_ptr<acto::actor,std::default_delete<acto::actor>>::
  unique_ptr<Listener,std::default_delete<Listener>,void>
            ((unique_ptr<acto::actor,std::default_delete<acto::actor>> *)&local_28,&local_30);
  an_object = core::make_instance(&local_20,shared,&local_28);
  actor_ref::actor_ref((actor_ref *)this,an_object,false);
  std::unique_ptr<acto::actor,_std::default_delete<acto::actor>_>::~unique_ptr(&local_28);
  std::unique_ptr<Listener,_std::default_delete<Listener>_>::~unique_ptr(&local_30);
  actor_ref::~actor_ref(&local_20);
  return (enable_if_t<std::is_base_of<_::acto::actor,_Listener>::value,_actor_ref>)(object_t *)this;
}

Assistant:

inline std::enable_if_t<std::is_base_of<::acto::actor, T>::value, actor_ref>
spawn(actor_ref context, P&&... p) {
  return actor_ref(
    core::make_instance(std::move(context), actor_thread::shared,
                        std::make_unique<T>(std::forward<P>(p)...)),
    false);
}